

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void CVmImageLoader::load_resources_from_fp(osfildef *fp,char *fname,CVmImageLoaderMres *res_ifc)

{
  undefined8 uVar1;
  uint uVar2;
  CVmFile *this;
  undefined8 *puVar3;
  long *plVar4;
  osfildef *in_RDI;
  err_frame_t err_cur__;
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  CVmFile *file;
  long in_stack_00001ed8;
  char *in_stack_00001ee0;
  CVmImageFile *in_stack_00001ee8;
  CVmImageLoader *in_stack_00001ef0;
  CVmFile *in_stack_fffffffffffffe98;
  CVmImageFileExt *in_stack_fffffffffffffea0;
  void *pvVar5;
  undefined4 in_stack_fffffffffffffee4;
  void *local_110;
  CVmImageLoaderMres *in_stack_ffffffffffffff38;
  CVmImageLoader *in_stack_ffffffffffffff40;
  void *local_30;
  long *local_28;
  
  local_28 = (long *)0x0;
  local_30 = (void *)0x0;
  this = (CVmFile *)operator_new(0x10);
  CVmFile::CVmFile(this);
  CVmFile::set_file(this,in_RDI,0);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  uVar1 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)&stack0xfffffffffffffee0;
  uVar2 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffef8);
  if (uVar2 == 0) {
    local_28 = (long *)operator_new(0x20);
    CVmImageFileExt::CVmImageFileExt(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_30 = operator_new(0x98);
    CVmImageLoader(in_stack_00001ef0,in_stack_00001ee8,in_stack_00001ee0,in_stack_00001ed8);
    load_resource_file(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  if ((uVar2 & 0x8000) == 0) {
    uVar2 = uVar2 | 0x8000;
    CVmFile::detach_file(this);
    if ((local_30 != (void *)0x0) && (local_30 != (void *)0x0)) {
      ~CVmImageLoader((CVmImageLoader *)CONCAT44(in_stack_fffffffffffffee4,uVar2));
      operator_delete(local_30,0x98);
    }
    if ((local_28 != (long *)0x0) && (local_28 != (long *)0x0)) {
      (**(code **)(*local_28 + 8))();
    }
    if (this != (CVmFile *)0x0) {
      CVmFile::~CVmFile((CVmFile *)in_stack_fffffffffffffea0);
      operator_delete(this,0x10);
    }
  }
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar1;
  if ((uVar2 & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar5 = local_110;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar5;
    err_rethrow();
  }
  if ((uVar2 & 2) != 0) {
    free(local_110);
  }
  return;
}

Assistant:

void CVmImageLoader::load_resources_from_fp(osfildef *fp,
                                            const char *fname,
                                            CVmImageLoaderMres *res_ifc)
{
    CVmFile *file;
    CVmImageFile *volatile imagefp = 0;
    CVmImageLoader *volatile loader = 0;

    /* create a file object for reading the file */
    file = new CVmFile();

    /* set up the file with our file handler */
    file->set_file(fp, 0);
    
    err_try
    {
        /* set up the loader */
        imagefp = new CVmImageFileExt(file);
        loader = new CVmImageLoader(imagefp, fname, 0);

        /* load the resource-only file */
        loader->load_resource_file(res_ifc);
    }